

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest9::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest9 *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void subroutineType1(inout float);\nsubroutine void subroutineType2(inout float);\nsubroutine void subroutineType3(inout float);\n\nsubroutine(subroutineType1, subroutineType2, subroutineType3) void function(inout float result)\n{\n    result += float(0.123) + float(gl_VertexID);\n}\n\nsubroutine uniform subroutineType1 subroutine_uniform1;\nsubroutine uniform subroutineType2 subroutine_uniform2;\nsubroutine uniform subroutineType3 subroutine_uniform3;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(0, 1, 2, 3);\n\n    subroutine_uniform1(result.x);\n    subroutine_uniform2(result.y);\n    subroutine_uniform3(result.z);\n\n    result.w += result.x + result.y + result.z;\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest9::getVertexShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "subroutine void subroutineType1(inout float);\n"
		   "subroutine void subroutineType2(inout float);\n"
		   "subroutine void subroutineType3(inout float);\n"
		   "\n"
		   "subroutine(subroutineType1, subroutineType2, subroutineType3) void function(inout float result)\n"
		   "{\n"
		   "    result += float(0.123) + float(gl_VertexID);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineType1 subroutine_uniform1;\n"
		   "subroutine uniform subroutineType2 subroutine_uniform2;\n"
		   "subroutine uniform subroutineType3 subroutine_uniform3;\n"
		   "\n"
		   "out vec4 result;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    result = vec4(0, 1, 2, 3);\n"
		   "\n"
		   "    subroutine_uniform1(result.x);\n"
		   "    subroutine_uniform2(result.y);\n"
		   "    subroutine_uniform3(result.z);\n"
		   "\n"
		   "    result.w += result.x + result.y + result.z;\n"
		   "}\n";
}